

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O0

ZyanStatus
ZydisFormatterBaseFormatOperandIMM
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  bool bVar1;
  ZyanBool absolute;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,199,
                  "ZyanStatus ZydisFormatterBaseFormatOperandIMM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context != (ZydisFormatterContext *)0x0) {
      if ((context->operand->field_10).imm.is_relative == '\0') {
        formatter_local._4_4_ = (*formatter->func_print_imm)(formatter,buffer,context);
      }
      else {
        bVar1 = false;
        if (formatter->force_relative_branches == '\0') {
          bVar1 = context->runtime_address != 0xffffffffffffffff;
        }
        if (bVar1) {
          formatter_local._4_4_ = (*formatter->func_print_address_abs)(formatter,buffer,context);
        }
        else {
          formatter_local._4_4_ = (*formatter->func_print_address_rel)(formatter,buffer,context);
        }
      }
      return formatter_local._4_4_;
    }
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xc9,
                  "ZyanStatus ZydisFormatterBaseFormatOperandIMM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                ,200,
                "ZyanStatus ZydisFormatterBaseFormatOperandIMM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterBaseFormatOperandIMM(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    // The immediate operand contains an address
    if (context->operand->imm.is_relative)
    {
        const ZyanBool absolute = !formatter->force_relative_branches &&
            (context->runtime_address != ZYDIS_RUNTIME_ADDRESS_NONE);
        if (absolute)
        {
            return formatter->func_print_address_abs(formatter, buffer, context);
        }
        return formatter->func_print_address_rel(formatter, buffer, context);
    }

    // The immediate operand contains an actual ordinal value
    return formatter->func_print_imm(formatter, buffer, context);
}